

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O1

int32 gauden_mllr_transform(gauden_t *g,ps_mllr_t *mllr,ps_config_t *config)

{
  int32 **ppiVar1;
  int iVar2;
  uint uVar3;
  mfcc_t ****ppppmVar4;
  float32 *pfVar5;
  float32 **ppfVar6;
  mfcc_t *pmVar7;
  mfcc_t *pmVar8;
  logmath_t *lmath;
  char *pcVar9;
  float ****ppppfVar10;
  void *ptr;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  int32 *flen;
  uint local_6c;
  uint local_68;
  uint local_64;
  int32 *local_60;
  int32 *local_58;
  int32 *local_50;
  int32 *local_48;
  ps_config_t *local_40;
  int32 **local_38;
  
  ppppmVar4 = g->mean;
  if (ppppmVar4 != (mfcc_t ****)0x0) {
    ckd_free(***ppppmVar4);
    ckd_free_3d(ppppmVar4);
  }
  ppppmVar4 = g->var;
  if (ppppmVar4 != (mfcc_t ****)0x0) {
    ckd_free(***ppppmVar4);
    ckd_free_3d(ppppmVar4);
  }
  if (g->det != (mfcc_t ***)0x0) {
    ckd_free_3d(g->det);
  }
  ppiVar1 = &g->featlen;
  if (g->featlen != (int32 *)0x0) {
    ckd_free(g->featlen);
  }
  g->det = (mfcc_t ***)0x0;
  g->featlen = (int32 *)0x0;
  pcVar9 = ps_config_str(config,"mean");
  local_58 = &g->n_mgau;
  local_60 = &g->n_feat;
  local_50 = &g->n_density;
  ppppfVar10 = gauden_param_read(pcVar9,local_58,local_60,local_50,ppiVar1);
  g->mean = (mfcc_t ****)ppppfVar10;
  pcVar9 = ps_config_str(config,"var");
  ppppfVar10 = gauden_param_read(pcVar9,(int32 *)&local_64,(int32 *)&local_68,(int32 *)&local_6c,
                                 &local_48);
  g->var = (mfcc_t ****)ppppfVar10;
  if (local_64 == g->n_mgau) {
    uVar15 = *local_60;
    if ((local_68 == uVar15) && (local_6c == *local_50)) {
      if (0 < (int)uVar15) {
        uVar12 = 0;
        do {
          if ((*ppiVar1)[uVar12] != local_48[uVar12]) {
            pcVar9 = "Feature lengths for means and variances differ\n";
            lVar16 = 0x21b;
            goto LAB_0014baac;
          }
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
      local_40 = config;
      local_38 = ppiVar1;
      ckd_free(local_48);
      uVar12 = (ulong)local_6c;
      if (0 < *local_58) {
        lVar16 = 0;
        do {
          if (*local_60 < 1) {
            lVar17 = 0;
          }
          else {
            lVar17 = 0;
            uVar15 = local_64;
            do {
              ppiVar1 = local_38;
              ptr = __ckd_calloc__((long)(*local_38)[lVar17],8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                   ,0x222);
              iVar2 = *local_50;
              if ((long)iVar2 < 1) {
                uVar12 = 0;
              }
              else {
                uVar3 = (*ppiVar1)[lVar17];
                uVar11 = (ulong)uVar3;
                uVar12 = 0;
                do {
                  if (0 < (int)uVar3) {
                    pfVar5 = *mllr->b[lVar17];
                    ppfVar6 = *mllr->A[lVar17];
                    pmVar7 = g->mean[lVar16][lVar17][uVar12];
                    uVar13 = 0;
                    do {
                      *(undefined8 *)((long)ptr + uVar13 * 8) = 0;
                      dVar18 = 0.0;
                      uVar14 = 0;
                      do {
                        dVar18 = dVar18 + (double)((float)ppfVar6[uVar13][uVar14] *
                                                  (float)pmVar7[uVar14]);
                        uVar14 = uVar14 + 1;
                      } while (uVar11 != uVar14);
                      *(double *)((long)ptr + uVar13 * 8) = dVar18;
                      *(double *)((long)ptr + uVar13 * 8) = (double)(float)pfVar5[uVar13] + dVar18;
                      uVar13 = uVar13 + 1;
                      uVar15 = uVar3;
                    } while (uVar13 != uVar11);
                  }
                  if (0 < (int)uVar3) {
                    pmVar7 = g->mean[lVar16][lVar17][uVar12];
                    pfVar5 = *mllr->h[lVar17];
                    pmVar8 = g->var[lVar16][lVar17][uVar12];
                    uVar13 = 0;
                    do {
                      pmVar7[uVar13] = (mfcc_t)(float)*(double *)((long)ptr + uVar13 * 8);
                      pmVar8[uVar13] = (mfcc_t)((float)pfVar5[uVar13] * (float)pmVar8[uVar13]);
                      uVar13 = uVar13 + 1;
                    } while (uVar11 != uVar13);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != (long)iVar2);
              }
              ckd_free(ptr);
              lVar17 = lVar17 + 1;
              local_64 = uVar15;
            } while (lVar17 < *local_60);
          }
          local_6c = (uint)uVar12;
          local_68 = (uint)lVar17;
          lVar16 = lVar16 + 1;
        } while (lVar16 < *local_58);
      }
      lmath = g->lmath;
      dVar18 = ps_config_float(local_40,"varfloor");
      gauden_dist_precompute(g,lmath,(float32)(float)dVar18);
      return 0;
    }
  }
  pcVar9 = "Mixture-gaussians dimensions for means and variances differ\n";
  lVar16 = 0x218;
LAB_0014baac:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
          ,lVar16,pcVar9);
  exit(1);
}

Assistant:

int32
gauden_mllr_transform(gauden_t *g, ps_mllr_t *mllr, ps_config_t *config)
{
    int32 i, m, f, d, *flen;

    /* Free data if already here */
    if (g->mean)
        gauden_param_free(g->mean);
    if (g->var)
        gauden_param_free(g->var);
    if (g->det)
        ckd_free_3d(g->det);
    if (g->featlen)
        ckd_free(g->featlen);
    g->det = NULL;
    g->featlen = NULL;

    /* Reload means and variances (un-precomputed). */
    g->mean = (mfcc_t ****)gauden_param_read(ps_config_str(config, "mean"), &g->n_mgau, &g->n_feat, &g->n_density,
                      &g->featlen);
    g->var = (mfcc_t ****)gauden_param_read(ps_config_str(config, "var"), &m, &f, &d, &flen);

    /* Verify mean and variance parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density))
        E_FATAL
            ("Mixture-gaussians dimensions for means and variances differ\n");
    for (i = 0; i < g->n_feat; i++)
        if (g->featlen[i] != flen[i])
            E_FATAL("Feature lengths for means and variances differ\n");
    ckd_free(flen);

    /* Transform codebook for each stream s */
    for (i = 0; i < g->n_mgau; ++i) {
        for (f = 0; f < g->n_feat; ++f) {
            float64 *temp;
            temp = (float64 *) ckd_calloc(g->featlen[f], sizeof(float64));
            /* Transform each density d in selected codebook */
            for (d = 0; d < g->n_density; d++) {
                int l;
                for (l = 0; l < g->featlen[f]; l++) {
                    temp[l] = 0.0;
                    for (m = 0; m < g->featlen[f]; m++) {
                        /* FIXME: For now, only one class, hence the zeros below. */
                        temp[l] += mllr->A[f][0][l][m] * g->mean[i][f][d][m];
                    }
                    temp[l] += mllr->b[f][0][l];
                }

                for (l = 0; l < g->featlen[f]; l++) {
                    g->mean[i][f][d][l] = (float32) temp[l];
                    g->var[i][f][d][l] *= mllr->h[f][0][l];
                }
            }
            ckd_free(temp);
        }
    }

    /* Re-precompute (if we aren't adapting variances this isn't
     * actually necessary...) */
    gauden_dist_precompute(g, g->lmath, ps_config_float(config, "varfloor"));
    return 0;
}